

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

int Matvec_SparseCSR(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  realtype *prVar4;
  realtype *prVar5;
  long *in_RDI;
  realtype *yd;
  realtype *xd;
  realtype *Ax;
  sunindextype *Aj;
  sunindextype *Ap;
  sunindextype j;
  sunindextype i;
  int local_28;
  int local_24;
  int local_4;
  
  lVar1 = *(long *)(*in_RDI + 0x28);
  lVar2 = *(long *)(*in_RDI + 0x20);
  lVar3 = *(long *)(*in_RDI + 0x10);
  if (((lVar1 == 0) || (lVar2 == 0)) || (lVar3 == 0)) {
    local_4 = -0x2be;
  }
  else {
    prVar4 = N_VGetArrayPointer((N_Vector)0xed7ac5);
    prVar5 = N_VGetArrayPointer((N_Vector)0xed7ad4);
    if (((prVar4 == (realtype *)0x0) || (prVar5 == (realtype *)0x0)) || (prVar4 == prVar5)) {
      local_4 = -0x2be;
    }
    else {
      for (local_24 = 0; local_24 < *(int *)*in_RDI; local_24 = local_24 + 1) {
        prVar5[local_24] = 0.0;
      }
      for (local_24 = 0; local_24 < *(int *)*in_RDI; local_24 = local_24 + 1) {
        for (local_28 = *(int *)(lVar1 + (long)local_24 * 4);
            local_28 < *(int *)(lVar1 + (long)(local_24 + 1) * 4); local_28 = local_28 + 1) {
          prVar5[local_24] =
               *(double *)(lVar3 + (long)local_28 * 8) *
               prVar4[*(int *)(lVar2 + (long)local_28 * 4)] + prVar5[local_24];
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Matvec_SparseCSR(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Aj;
  realtype *Ax, *xd, *yd;

  /* access data from CSR structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Aj = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Aj == NULL) || (Ax == NULL))
    return SUNMAT_MEM_FAIL;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return SUNMAT_MEM_FAIL;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix rows */
  for (i=0; i<SM_ROWS_S(A); i++) {

    /* iterate along row of A, performing product */
    for (j=Ap[i]; j<Ap[i+1]; j++)
      yd[i] += Ax[j]*xd[Aj[j]];

  }

  return(0);
}